

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O2

int format_octal(int64_t v,char *p,int s)

{
  int iVar1;
  ulong uVar2;
  int len;
  char *pcVar3;
  
  if (v < 0) {
    iVar1 = -1;
    for (; 0 < s; s = s + -1) {
      *p = '0';
      p = p + 1;
    }
  }
  else {
    for (uVar2 = (ulong)(uint)s; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
      p[uVar2 - 1] = (byte)v & 7 | 0x30;
      v = (ulong)v >> 3;
    }
    if (v == 0) {
      iVar1 = 0;
    }
    else {
      pcVar3 = p + uVar2;
      iVar1 = -1;
      for (; 0 < s; s = s + -1) {
        *pcVar3 = '7';
        pcVar3 = pcVar3 + 1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int
format_octal(int64_t v, char *p, int s)
{
	int len = s;

	/* Octal values can't be negative, so use 0. */
	if (v < 0)
		v = 0;

	p += s;		/* Start at the end and work backwards. */
	while (s-- > 0) {
		*--p = (char)('0' + (v & 7));
		v >>= 3;
	}

	if (v == 0)
		return (0);

	/* If it overflowed, fill field with max value. */
	while (len-- > 0)
		*p++ = '7';

	return (-1);
}